

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_msl_resource_binding(CompilerMSL *this,MSLResourceBinding *binding)

{
  mapped_type mVar1;
  uint32_t uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  CompilerError *this_00;
  StageSetBinding arg_idx_tuple;
  uint32_t uStack_4c;
  uint32_t local_48;
  uint32_t uStack_44;
  uint32_t uStack_40;
  uint32_t uStack_3c;
  key_type local_2c;
  
  local_2c.model = binding->stage;
  local_2c.desc_set = binding->desc_set;
  local_2c.binding = binding->binding;
  arg_idx_tuple.model = binding->stage;
  arg_idx_tuple.desc_set = binding->basetype;
  arg_idx_tuple.binding = binding->desc_set;
  uStack_4c = binding->binding;
  uVar3 = binding->count;
  uVar4 = binding->msl_buffer;
  uVar5 = binding->msl_texture;
  uVar6 = binding->msl_sampler;
  pmVar7 = ::std::__detail::
           _Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->resource_bindings,&local_2c);
  (pmVar7->first).stage = arg_idx_tuple.model;
  (pmVar7->first).basetype = arg_idx_tuple.desc_set;
  (pmVar7->first).desc_set = arg_idx_tuple.binding;
  (pmVar7->first).binding = uStack_4c;
  (pmVar7->first).count = uVar3;
  (pmVar7->first).msl_buffer = uVar4;
  (pmVar7->first).msl_texture = uVar5;
  (pmVar7->first).msl_sampler = uVar6;
  pmVar7->second = false;
  if ((this->msl_options).pad_argument_buffer_resources == true) {
    arg_idx_tuple.desc_set = binding->desc_set;
    arg_idx_tuple.model = binding->stage;
    stack0xffffffffffffffb0 = CONCAT44(uStack_4c,0xffffffff);
    switch(binding->basetype) {
    case Void:
    case Boolean:
    case SByte:
    case UByte:
    case Short:
    case UShort:
    case Int:
    case UInt:
    case Int64:
    case UInt64:
    case AtomicCounter:
    case Half:
    case Float:
    case Double:
      uVar2 = binding->msl_buffer;
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,
                 "Unexpected argument buffer resource base type. When padding argument buffer elements, all descriptor set resources must be supplied with a base type by the app."
                );
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    case Image:
      uVar2 = binding->msl_texture;
      break;
    case SampledImage:
      arg_idx_tuple.binding = binding->msl_texture;
      mVar1 = binding->binding;
      pmVar8 = ::std::__detail::
               _Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->resource_arg_buff_idx_to_binding_number,&arg_idx_tuple);
      *pmVar8 = mVar1;
      uVar2 = binding->msl_sampler;
      break;
    case Sampler:
      uVar2 = binding->msl_sampler;
    }
    stack0xffffffffffffffb0 = CONCAT44(uStack_4c,uVar2);
    mVar1 = binding->binding;
    pmVar8 = ::std::__detail::
             _Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->resource_arg_buff_idx_to_binding_number,&arg_idx_tuple);
    *pmVar8 = mVar1;
  }
  return;
}

Assistant:

void CompilerMSL::add_msl_resource_binding(const MSLResourceBinding &binding)
{
	StageSetBinding tuple = { binding.stage, binding.desc_set, binding.binding };
	resource_bindings[tuple] = { binding, false };

	// If we might need to pad argument buffer members to positionally align
	// arg buffer indexes, also maintain a lookup by argument buffer index.
	if (msl_options.pad_argument_buffer_resources)
	{
		StageSetBinding arg_idx_tuple = { binding.stage, binding.desc_set, k_unknown_component };

#define ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(rez) \
	arg_idx_tuple.binding = binding.msl_##rez; \
	resource_arg_buff_idx_to_binding_number[arg_idx_tuple] = binding.binding

		switch (binding.basetype)
		{
		case SPIRType::Void:
		case SPIRType::Boolean:
		case SPIRType::SByte:
		case SPIRType::UByte:
		case SPIRType::Short:
		case SPIRType::UShort:
		case SPIRType::Int:
		case SPIRType::UInt:
		case SPIRType::Int64:
		case SPIRType::UInt64:
		case SPIRType::AtomicCounter:
		case SPIRType::Half:
		case SPIRType::Float:
		case SPIRType::Double:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(buffer);
			break;
		case SPIRType::Image:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(texture);
			break;
		case SPIRType::Sampler:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(sampler);
			break;
		case SPIRType::SampledImage:
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(texture);
			ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP(sampler);
			break;
		default:
			SPIRV_CROSS_THROW("Unexpected argument buffer resource base type. When padding argument buffer elements, "
			                  "all descriptor set resources must be supplied with a base type by the app.");
		}
#undef ADD_ARG_IDX_TO_BINDING_NUM_LOOKUP
	}
}